

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O1

MessageOptions * __thiscall
google::protobuf::DescriptorProto::mutable_options(DescriptorProto *this)

{
  MessageOptions *pMVar1;
  Arena *arena;
  
  *(byte *)&this->field_0 = *(byte *)&this->field_0 | 2;
  if ((this->field_0)._impl_.options_ == (MessageOptions *)0x0) {
    arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar1 = (MessageOptions *)Arena::DefaultConstruct<google::protobuf::MessageOptions>(arena);
    (this->field_0)._impl_.options_ = pMVar1;
  }
  return (this->field_0)._impl_.options_;
}

Assistant:

inline ::google::protobuf::MessageOptions* DescriptorProto::mutable_options() ABSL_ATTRIBUTE_LIFETIME_BOUND {
  _impl_._has_bits_[0] |= 0x00000002u;
  ::google::protobuf::MessageOptions* _msg = _internal_mutable_options();
  // @@protoc_insertion_point(field_mutable:google.protobuf.DescriptorProto.options)
  return _msg;
}